

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O0

BufferView * __thiscall PEFile::createSectionView(PEFile *this,size_t secId)

{
  SectionHdrWrapper *sec_00;
  SectionHdrWrapper *sec;
  WatchedLocker lock;
  size_t secId_local;
  PEFile *this_local;
  
  lock._48_8_ = secId;
  WatchedLocker::WatchedLocker((WatchedLocker *)&sec,&this->m_peMutex,false,"createSectionView");
  sec_00 = _getSecHdr(this,lock._48_8_);
  if (sec_00 == (SectionHdrWrapper *)0x0) {
    Logger::append(D_WARNING,"No such section");
    this_local = (PEFile *)0x0;
  }
  else {
    this_local = (PEFile *)_createSectionView(this,sec_00);
  }
  WatchedLocker::~WatchedLocker((WatchedLocker *)&sec);
  return (BufferView *)this_local;
}

Assistant:

BufferView* PEFile::createSectionView(size_t secId)
{
    WatchedLocker lock(&m_peMutex, PE_SHOW_LOCK, __FUNCTION__);
    SectionHdrWrapper *sec = this->_getSecHdr(secId);
    if (!sec) {
        Logger::append(Logger::D_WARNING, "No such section");
        return NULL;
    }
    return _createSectionView(sec);
}